

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void __thiscall QApplicationPrivate::process_cmdline(QApplicationPrivate *this)

{
  char *pcVar1;
  QArrayData *pQVar2;
  undefined8 uVar3;
  QArrayData *pQVar4;
  int iVar5;
  int iVar6;
  storage_type *psVar7;
  long lVar8;
  int iVar9;
  storage_type *psVar10;
  char *__s1;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QArrayData *local_58;
  undefined8 uStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (_topLevelAt == 0) {
    qEnvironmentVariable((char *)&local_58);
    lVar12 = local_48;
    pQVar4 = local_58;
    uVar3 = _create;
    pQVar2 = QGuiApplicationPrivate::styleOverride;
    lVar8 = _topLevelAt;
    _create = uStack_50;
    local_58 = QGuiApplicationPrivate::styleOverride;
    QGuiApplicationPrivate::styleOverride = pQVar4;
    uStack_50 = uVar3;
    local_48 = _topLevelAt;
    _topLevelAt = lVar12;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if ((qt_is_tty_app == '\0') && (iVar6 = **(int **)&this->field_0x80, iVar6 != 0)) {
    iVar11 = 1;
    if (1 < iVar6) {
      iVar9 = 1;
      do {
        lVar12 = (long)iVar9;
        pcVar1 = *(char **)(*(long *)&this->field_0x88 + lVar12 * 8);
        if (pcVar1 != (char *)0x0) {
          if (*pcVar1 == '-') {
            __s1 = pcVar1 + 1;
            if (pcVar1[1] != '-') {
              __s1 = pcVar1;
            }
            iVar5 = strcmp(__s1,"-qdevel");
            if ((iVar5 != 0) && (iVar5 = strcmp(__s1,"-qdebug"), iVar5 != 0)) {
              iVar5 = strcmp(__s1,"-stylesheet");
              if ((iVar5 == 0) && (iVar9 < iVar6 + -1)) {
                QVar13.m_data = "file:///";
                QVar13.m_size = 8;
                QString::operator=(&styleSheet,QVar13);
                lVar12 = *(long *)(*(long *)&this->field_0x88 + 8 + lVar12 * 8);
                if (lVar12 == 0) {
                  psVar10 = (storage_type *)0x0;
                }
                else {
                  psVar7 = (storage_type *)0xffffffffffffffff;
                  do {
                    psVar10 = psVar7 + 1;
                    pcVar1 = psVar7 + lVar12 + 1;
                    psVar7 = psVar10;
                  } while (*pcVar1 != '\0');
                }
                QVar16.m_data = psVar10;
                QVar16.m_size = (qsizetype)&local_58;
                QString::fromLocal8Bit(QVar16);
                QString::append((QString *)&styleSheet);
                if (local_58 != (QArrayData *)0x0) {
                  LOCK();
                  (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_58,2,0x10);
                  }
                }
                iVar9 = iVar9 + 1;
              }
              else {
                iVar6 = strncmp(__s1,"-stylesheet=",0xc);
                if (iVar6 == 0) {
                  QVar14.m_data = "file:///";
                  QVar14.m_size = 8;
                  QString::operator=(&styleSheet,QVar14);
                  psVar10 = (storage_type *)0xffffffffffffffff;
                  do {
                    pcVar1 = __s1 + 0xd + (long)psVar10;
                    psVar10 = psVar10 + 1;
                  } while (*pcVar1 != '\0');
                  QVar15.m_data = psVar10;
                  QVar15.m_size = (qsizetype)&local_58;
                  QString::fromLocal8Bit(QVar15);
                  QString::append((QString *)&styleSheet);
                  if (local_58 != (QArrayData *)0x0) {
                    LOCK();
                    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_58,2,0x10);
                    }
                  }
                }
                else {
                  iVar6 = qstrcmp(__s1,"-widgetcount");
                  if (iVar6 == 0) {
                    widgetCount = true;
                  }
                  else {
                    lVar8 = (long)iVar11;
                    iVar11 = iVar11 + 1;
                    *(undefined8 *)(*(long *)&this->field_0x88 + lVar8 * 8) =
                         *(undefined8 *)(*(long *)&this->field_0x88 + lVar12 * 8);
                  }
                }
              }
            }
          }
          else {
            lVar12 = (long)iVar11;
            iVar11 = iVar11 + 1;
            *(char **)(*(long *)&this->field_0x88 + lVar12 * 8) = pcVar1;
          }
        }
        iVar9 = iVar9 + 1;
        iVar6 = **(int **)&this->field_0x80;
      } while (iVar9 < iVar6);
    }
    if (iVar11 < iVar6) {
      *(undefined8 *)(*(long *)&this->field_0x88 + (long)iVar11 * 8) = 0;
      **(int **)&this->field_0x80 = iVar11;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::process_cmdline()
{
    if (styleOverride.isEmpty())
        styleOverride = qEnvironmentVariable("QT_STYLE_OVERRIDE");

    // process platform-indep command line
    if (qt_is_tty_app || !argc)
        return;

    int i, j;

    j = 1;
    for (i=1; i<argc; i++) { // if you add anything here, modify QCoreApplication::arguments()
        if (!argv[i])
            continue;
        if (*argv[i] != '-') {
            argv[j++] = argv[i];
            continue;
        }
        const char *arg = argv[i];
        if (arg[1] == '-') // startsWith("--")
            ++arg;
        if (strcmp(arg, "-qdevel") == 0 || strcmp(arg, "-qdebug") == 0) {
            // obsolete argument
#ifndef QT_NO_STYLE_STYLESHEET
        } else if (strcmp(arg, "-stylesheet") == 0 && i < argc -1) {
            styleSheet = "file:///"_L1;
            styleSheet.append(QString::fromLocal8Bit(argv[++i]));
        } else if (strncmp(arg, "-stylesheet=", 12) == 0) {
            styleSheet = "file:///"_L1;
            styleSheet.append(QString::fromLocal8Bit(arg + 12));
#endif
        } else if (qstrcmp(arg, "-widgetcount") == 0) {
            widgetCount = true;
        } else {
            argv[j++] = argv[i];
        }
    }

    if (j < argc) {
        argv[j] = nullptr;
        argc = j;
    }
}